

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1a7e4::TestCanSetandGetDetails::RunImpl(TestCanSetandGetDetails *this)

{
  TestDetails *pTVar1;
  TestResults *this_00;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  ScopedCurrentTest scopedTest;
  
  ScopedCurrentTest::ScopedCurrentTest(&scopedTest);
  ppTVar2 = UnitTest::CurrentTest::Details();
  *ppTVar2 = (TestDetails *)0x3039;
  ppTVar2 = UnitTest::CurrentTest::Details();
  pTVar1 = *ppTVar2;
  ScopedCurrentTest::~ScopedCurrentTest(&scopedTest);
  if (pTVar1 != (TestDetails *)0x3039) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar2 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&scopedTest,*ppTVar2,0x14);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)&scopedTest,"ok");
  }
  return;
}

Assistant:

TEST(CanSetandGetDetails)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		const UnitTest::TestDetails* details = reinterpret_cast< const UnitTest::TestDetails* >(12345);
		UnitTest::CurrentTest::Details() = details;

		ok = (UnitTest::CurrentTest::Details() == details);
	}

	CHECK(ok);
}